

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_buffer.c
# Opt level: O2

int lj_cf_buffer_method_reset(lua_State *L)

{
  ulong uVar1;
  SBufExt *pSVar2;
  char *pcVar3;
  
  pSVar2 = buffer_tobuf(L);
  uVar1 = (pSVar2->L).ptr64;
  if ((uVar1 & 2) == 0) {
    pcVar3 = pSVar2->b;
  }
  else {
    (pSVar2->L).ptr64 = uVar1 & 0xfffffffffffffffd;
    pSVar2->field_4 = (anon_union_8_2_d9f1b0d6_for_SBufExt_4)0x0;
    pSVar2->e = (char *)0x0;
    pSVar2->b = (char *)0x0;
    pcVar3 = (char *)0x0;
  }
  pSVar2->w = pcVar3;
  pSVar2->r = pcVar3;
  L->top = L->base + 1;
  return 1;
}

Assistant:

LJLIB_CF(buffer_method_reset)		LJLIB_REC(.)
{
  SBufExt *sbx = buffer_tobuf(L);
  lj_bufx_reset(sbx);
  L->top = L->base+1;  /* Chain buffer object. */
  return 1;
}